

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiff_io.cc
# Opt level: O2

void __thiscall
gimage::TIFFImageIO::loadHeader(TIFFImageIO *this,char *name,long *width,long *height,int *depth)

{
  long lVar1;
  IOException *this_00;
  allocator local_99;
  uint *local_98;
  uint16_t d;
  uint32_t h;
  uint32_t w;
  
  local_98 = (uint *)depth;
  lVar1 = TIFFOpen(name,"r");
  if (lVar1 != 0) {
    TIFFGetField(lVar1,0x100,&w);
    TIFFGetField(lVar1,0x101,&h);
    TIFFGetField(lVar1,0x115,&d);
    *width = (ulong)w;
    *height = (ulong)h;
    *local_98 = (uint)d;
    TIFFClose(lVar1);
    return;
  }
  this_00 = (IOException *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string((string *)&d,name,&local_99);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&h,
                 "Can only load TIFF image (",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&d);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&w,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&h,")");
  gutil::IOException::IOException(this_00,(string *)&w);
  __cxa_throw(this_00,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
}

Assistant:

void TIFFImageIO::loadHeader(const char *name, long &width, long &height, int &depth) const
{
  TIFF *tif=TIFFOpen(name, "r");

  if (tif == 0)
  {
    throw gutil::IOException("Can only load TIFF image ("+std::string(name)+")");
  }

  uint32_t w, h;
  uint16_t d;

  TIFFGetField(tif, TIFFTAG_IMAGEWIDTH, &w);
  TIFFGetField(tif, TIFFTAG_IMAGELENGTH, &h);
  TIFFGetField(tif, TIFFTAG_SAMPLESPERPIXEL, &d);

  width=w;
  height=h;
  depth=d;

  TIFFClose(tif);
}